

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O3

void uprv_getStaticCurrencyName_63(UChar *iso,char *loc,UnicodeString *result,UErrorCode *ec)

{
  short sVar1;
  undefined8 in_RAX;
  UChar *srcChars;
  int32_t length;
  UBool isChoiceFormat;
  int32_t len;
  UBool local_25;
  int32_t local_24;
  
  local_24 = (int32_t)((ulong)in_RAX >> 0x20);
  srcChars = ucurr_getName_63(iso,loc,UCURR_SYMBOL_NAME,&local_25,&local_24,ec);
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    icu_63::UnicodeString::unBogus(result);
    sVar1 = (result->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      length = (result->fUnion).fFields.fLength;
    }
    else {
      length = (int)sVar1 >> 5;
    }
    icu_63::UnicodeString::doReplace(result,0,length,srcChars,0,local_24);
  }
  return;
}

Assistant:

U_CAPI void
uprv_getStaticCurrencyName(const UChar* iso, const char* loc,
                           icu::UnicodeString& result, UErrorCode& ec)
{
    U_NAMESPACE_USE

    UBool isChoiceFormat;
    int32_t len;
    const UChar* currname = ucurr_getName(iso, loc, UCURR_SYMBOL_NAME,
                                          &isChoiceFormat, &len, &ec);
    if (U_SUCCESS(ec)) {
        result.setTo(currname, len);
    }
}